

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_zip.c
# Opt level: O0

exr_result_t apply_zip_impl(exr_encode_pipeline_t *encode)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  exr_result_t eVar4;
  size_t in_RDI;
  size_t unaff_retaddr;
  exr_const_context_t pctxt;
  exr_result_t rv;
  size_t compbufsz;
  int level;
  size_t *in_stack_00000030;
  undefined1 *puVar5;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined1 local_20 [4];
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  uVar3 = _local_20;
  uVar2 = _local_20 >> 0x20;
  eVar4 = exr_get_zip_compression_level
                    ((exr_const_context_t)
                     CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),(int)uVar2,
                     (int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  _local_20 = uVar3;
  if (eVar4 == 0) {
    internal_zip_deconstruct_bytes
              (*(uint8_t **)(in_RDI + 0xc0),*(uint8_t **)(in_RDI + 0x68),
               *(uint64_t *)(in_RDI + 0x70));
    puVar5 = local_20;
    eVar4 = exr_compress_buffer((exr_const_context_t)compbufsz,rv,pctxt,unaff_retaddr,
                                (void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8
                                                ),in_RDI,in_stack_00000030);
    if (eVar4 == 0) {
      if (*(ulong *)(in_RDI + 0x70) < _local_20) {
        memcpy(*(void **)(in_RDI + 0xa8),*(void **)(in_RDI + 0x68),*(size_t *)(in_RDI + 0x70));
        _local_20 = *(ulong *)(in_RDI + 0x70);
      }
      *(ulong *)(in_RDI + 0xb0) = _local_20;
    }
    else {
      lVar1 = *(long *)(in_RDI + 0x18);
      if (lVar1 != 0) {
        (**(code **)(lVar1 + 0x48))
                  (lVar1,eVar4,"Unable to compress buffer %lu -> %lu @ level %d",
                   *(undefined8 *)(in_RDI + 0x70),*(undefined8 *)(in_RDI + 0xb8),
                   in_stack_ffffffffffffffec,puVar5);
      }
    }
  }
  return eVar4;
}

Assistant:

static exr_result_t
apply_zip_impl (exr_encode_pipeline_t* encode)
{
    int          level;
    size_t       compbufsz;
    exr_result_t rv;

    rv = exr_get_zip_compression_level (
        encode->context, encode->part_index, &level);
    if (rv != EXR_ERR_SUCCESS) return rv;

    internal_zip_deconstruct_bytes (
        encode->scratch_buffer_1, encode->packed_buffer, encode->packed_bytes);

    rv = exr_compress_buffer (
        encode->context,
        level,
        encode->scratch_buffer_1,
        encode->packed_bytes,
        encode->compressed_buffer,
        encode->compressed_alloc_size,
        &compbufsz);

    if (rv == EXR_ERR_SUCCESS)
    {
        if (compbufsz > encode->packed_bytes)
        {
            memcpy (
                encode->compressed_buffer,
                encode->packed_buffer,
                encode->packed_bytes);
            compbufsz = encode->packed_bytes;
        }
        encode->compressed_bytes = compbufsz;
    }
    else
    {
        exr_const_context_t pctxt = encode->context;
        if (pctxt)
            pctxt->print_error (
                pctxt,
                rv,
                "Unable to compress buffer %" PRIu64 " -> %" PRIu64
                " @ level %d",
                encode->packed_bytes,
                (uint64_t) encode->compressed_alloc_size,
                level);
    }

    return rv;
}